

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O0

int Timidity::update_vibrato(float output_rate,Voice *vp,int sign)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double pb;
  double a;
  int local_20;
  int phase;
  int depth;
  int sign_local;
  Voice *vp_local;
  float output_rate_local;
  
  iVar4 = vp->vibrato_phase;
  vp->vibrato_phase = iVar4 + 1;
  if (0x3e < iVar4) {
    vp->vibrato_phase = 0;
  }
  iVar4 = vib_phase_to_inc_ptr(vp->vibrato_phase);
  if (vp->vibrato_sample_increment[iVar4] == 0) {
    local_20 = (uint)vp->sample->vibrato_depth * 0x80;
    if (vp->vibrato_sweep != 0) {
      vp->vibrato_sweep_position = vp->vibrato_sweep + vp->vibrato_sweep_position;
      if (vp->vibrato_sweep_position < 0x10000) {
        local_20 = vp->vibrato_sweep_position * local_20 >> 0x10;
      }
      else {
        vp->vibrato_sweep = 0;
      }
    }
    iVar3 = vp->sample->sample_rate;
    fVar1 = vp->frequency;
    fVar2 = vp->sample->root_freq;
    dVar5 = sin((double)vp->vibrato_phase * 0.015625 * 0.006135923151542565);
    dVar5 = pow(2.0,(dVar5 * (double)local_20 * 1.0) / 98304.0);
    pb = dVar5 * (((double)iVar3 * (double)fVar1) / ((double)fVar2 * (double)output_rate)) * 4096.0;
    if (vp->vibrato_sweep == 0) {
      vp->vibrato_sample_increment[iVar4] = (int)pb;
    }
    if (sign != 0) {
      pb = -pb;
    }
    vp_local._4_4_ = (int)pb;
  }
  else if (sign == 0) {
    vp_local._4_4_ = vp->vibrato_sample_increment[iVar4];
  }
  else {
    vp_local._4_4_ = -vp->vibrato_sample_increment[iVar4];
  }
  return vp_local._4_4_;
}

Assistant:

static int update_vibrato(float output_rate, Voice *vp, int sign)
{
	int depth;
	int phase;
	double a, pb;

	if (vp->vibrato_phase++ >= 2 * VIBRATO_SAMPLE_INCREMENTS - 1)
		vp->vibrato_phase = 0;
	phase = vib_phase_to_inc_ptr(vp->vibrato_phase);

	if (vp->vibrato_sample_increment[phase])
	{
		if (sign)
			return -vp->vibrato_sample_increment[phase];
		else
			return vp->vibrato_sample_increment[phase];
	}

	/* Need to compute this sample increment. */
	depth = vp->sample->vibrato_depth << 7;

	if (vp->vibrato_sweep != 0)
	{
		/* Need to update sweep */
		vp->vibrato_sweep_position += vp->vibrato_sweep;
		if (vp->vibrato_sweep_position >= (1<<SWEEP_SHIFT))
			vp->vibrato_sweep=0;
		else
		{
			/* Adjust depth */
			depth *= vp->vibrato_sweep_position;
			depth >>= SWEEP_SHIFT;
		}
	}

	a = FSCALE(((double)(vp->sample->sample_rate) * vp->frequency) /
		((double)(vp->sample->root_freq) * output_rate),
		FRACTION_BITS);

	pb = (sine(vp->vibrato_phase * (1.0/(2*VIBRATO_SAMPLE_INCREMENTS)))
		* (double)(depth) * VIBRATO_AMPLITUDE_TUNING);

	a *= pow(2.0, pb / (8192 * 12.f));

	/* If the sweep's over, we can store the newly computed sample_increment */
	if (!vp->vibrato_sweep)
		vp->vibrato_sample_increment[phase] = (int) a;

	if (sign)
		a = -a; /* need to preserve the loop direction */

	return (int) a;
}